

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O2

Window createDummyWindow(QOffscreenX11Info *x11,XVisualInfo *visualInfo)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  Colormap CVar4;
  Window WVar5;
  long lVar6;
  long in_FS_OFFSET;
  XSetWindowAttributes a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = x11->m_connection->m_display;
  CVar4 = XCreateColormap(pvVar2,*(undefined8 *)
                                  (*(long *)((long)pvVar2 + 0xe8) + 0x10 +
                                  (long)*(int *)((long)pvVar2 + 0xe0) * 0x80),visualInfo->visual,0);
  a.cursor._0_4_ = 0xaaaaaaaa;
  a.cursor._4_4_ = 0xaaaaaaaa;
  a.do_not_propagate_mask._0_4_ = 0xaaaaaaaa;
  a.do_not_propagate_mask._4_4_ = 0xaaaaaaaa;
  a.override_redirect = -0x55555556;
  a._92_4_ = 0xaaaaaaaa;
  a.save_under = -0x55555556;
  a._68_4_ = 0xaaaaaaaa;
  a.event_mask._0_4_ = 0xaaaaaaaa;
  a.event_mask._4_4_ = 0xaaaaaaaa;
  a.backing_planes._0_4_ = 0xaaaaaaaa;
  a.backing_planes._4_4_ = 0xaaaaaaaa;
  a.backing_pixel._0_4_ = 0xaaaaaaaa;
  a.backing_pixel._4_4_ = 0xaaaaaaaa;
  a.bit_gravity = -0x55555556;
  a.win_gravity = -0x55555556;
  a.backing_store = -0x55555556;
  a._44_4_ = 0xaaaaaaaa;
  a.border_pixmap._0_4_ = 0xaaaaaaaa;
  a.border_pixmap._4_4_ = 0xaaaaaaaa;
  a.background_pixmap._0_4_ = 0xaaaaaaaa;
  a.background_pixmap._4_4_ = 0xaaaaaaaa;
  pvVar2 = x11->m_connection->m_display;
  lVar3 = *(long *)((long)pvVar2 + 0xe8);
  lVar6 = (long)x11->m_connection->m_screenNumber * 0x80;
  a.background_pixel = *(unsigned_long *)(lVar3 + 0x58 + lVar6);
  a.border_pixel = *(unsigned_long *)(lVar3 + 0x60 + lVar6);
  a.colormap = CVar4;
  WVar5 = XCreateWindow(pvVar2,*(undefined8 *)
                                (lVar3 + 0x10 + (long)*(int *)((long)pvVar2 + 0xe0) * 0x80),0,0,100,
                        100,0,visualInfo->depth,1,visualInfo->visual,0x200a,&a);
  XFreeColormap(x11->m_connection->m_display,CVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return WVar5;
  }
  __stack_chk_fail();
}

Assistant:

static Window createDummyWindow(QOffscreenX11Info *x11, XVisualInfo *visualInfo)
{
    Colormap cmap = XCreateColormap(x11->display(), x11->root(), visualInfo->visual, AllocNone);
    XSetWindowAttributes a;
    a.background_pixel = WhitePixel(x11->display(), x11->screenNumber());
    a.border_pixel = BlackPixel(x11->display(), x11->screenNumber());
    a.colormap = cmap;


    Window window = XCreateWindow(x11->display(), x11->root(),
                                  0, 0, 100, 100,
                                  0, visualInfo->depth, InputOutput, visualInfo->visual,
                                  CWBackPixel|CWBorderPixel|CWColormap, &a);
    XFreeColormap(x11->display(), cmap);
    return window;
}